

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

bool llvm::consumeUnsignedInteger(StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  byte bVar1;
  short *psVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  bool bVar11;
  
  if (Radix != 0) goto LAB_00dba795;
  uVar9 = Str->Length;
  Radix = 10;
  if (uVar9 == 0) goto LAB_00dba795;
  if (uVar9 == 1) {
LAB_00dba87d:
    if (((uVar9 == 1) || (pcVar4 = Str->Data, *pcVar4 != '0')) || (9 < (byte)(pcVar4[1] - 0x30U)))
    goto LAB_00dba795;
    pcVar4 = pcVar4 + 1;
    sVar3 = uVar9 - 1;
LAB_00dba8ab:
    Radix = 8;
  }
  else {
    psVar2 = (short *)Str->Data;
    if (*psVar2 != 0x7830) {
      if (uVar9 == 1) goto LAB_00dba87d;
      if (*psVar2 == 0x5830) goto LAB_00dba8e3;
      if ((*psVar2 == 0x6230) || (*psVar2 == 0x4230)) {
        uVar8 = 2;
        if (uVar9 < 2) {
          uVar8 = uVar9;
        }
        pcVar4 = (char *)((long)psVar2 + uVar8);
        sVar3 = uVar9 - uVar8;
        Radix = 2;
        goto LAB_00dba8fb;
      }
      if (*psVar2 != 0x6f30) goto LAB_00dba87d;
      uVar8 = 2;
      if (uVar9 < 2) {
        uVar8 = uVar9;
      }
      pcVar4 = (char *)((long)psVar2 + uVar8);
      sVar3 = uVar9 - uVar8;
      goto LAB_00dba8ab;
    }
LAB_00dba8e3:
    uVar8 = 2;
    if (uVar9 < 2) {
      uVar8 = uVar9;
    }
    pcVar4 = (char *)((long)psVar2 + uVar8);
    sVar3 = uVar9 - uVar8;
    Radix = 0x10;
  }
LAB_00dba8fb:
  Str->Data = pcVar4;
  Str->Length = sVar3;
LAB_00dba795:
  sVar3 = Str->Length;
  bVar6 = true;
  if (sVar3 != 0) {
    pbVar10 = (byte *)Str->Data;
    *Result = 0;
    uVar9 = 0;
    sVar5 = sVar3;
    do {
      if (sVar5 == 0) goto LAB_00dba83a;
      bVar1 = *pbVar10;
      iVar7 = -0x30;
      if (((((byte)(bVar1 - 0x30) < 10) || (iVar7 = -0x57, (byte)(bVar1 + 0x9f) < 0x1a)) ||
          (iVar7 = -0x37, (byte)(bVar1 + 0xbf) < 0x1a)) && (iVar7 + (uint)bVar1 < Radix)) {
        uVar8 = (ulong)(iVar7 + (uint)bVar1) + uVar9 * Radix;
        *Result = uVar8;
        iVar7 = 1;
        bVar11 = uVar9 <= uVar8 / Radix;
        uVar9 = uVar8;
        if (bVar11) {
          pbVar10 = pbVar10 + 1;
          sVar5 = sVar5 - 1;
          iVar7 = 0;
        }
      }
      else {
        iVar7 = 3;
      }
    } while (iVar7 == 0);
    if (iVar7 == 3) {
LAB_00dba83a:
      if (sVar3 != sVar5) {
        Str->Data = (char *)pbVar10;
        Str->Length = sVar5;
        bVar6 = false;
      }
    }
  }
  return bVar6;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}